

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

void __thiscall RtApiPulse::callbackEvent(RtApiPulse *this)

{
  StreamMutex *pSVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *puVar4;
  code *pcVar5;
  char *inBuffer;
  StreamState SVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ostream *poVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  int pa_error;
  char *local_58;
  string local_50 [32];
  
  puVar4 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
  SVar6 = (this->super_RtApi).stream_.state;
  if (SVar6 == STREAM_STOPPED) {
    pSVar1 = &(this->super_RtApi).stream_.mutex;
    pthread_mutex_lock((pthread_mutex_t *)pSVar1);
    while (*(char *)(puVar4 + 9) == '\0') {
      pthread_cond_wait((pthread_cond_t *)(puVar4 + 3),(pthread_mutex_t *)pSVar1);
    }
    SVar6 = (this->super_RtApi).stream_.state;
    pthread_mutex_unlock((pthread_mutex_t *)pSVar1);
    if (SVar6 != STREAM_RUNNING) {
      return;
    }
    SVar6 = (this->super_RtApi).stream_.state;
  }
  if (SVar6 == STREAM_CLOSED) {
    std::__cxx11::string::assign((char *)&(this->super_RtApi).errorText_);
    RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
    return;
  }
  pcVar5 = (code *)(this->super_RtApi).stream_.callbackInfo.callback;
  (*(this->super_RtApi)._vptr_RtApi[9])(this);
  iVar7 = (*pcVar5)((this->super_RtApi).stream_.userBuffer[0],
                    (this->super_RtApi).stream_.userBuffer[1],(this->super_RtApi).stream_.bufferSize
                    ,0,(this->super_RtApi).stream_.callbackInfo.userData);
  if (iVar7 != 2) {
    pSVar1 = &(this->super_RtApi).stream_.mutex;
    pthread_mutex_lock((pthread_mutex_t *)pSVar1);
    pcVar13 = (this->super_RtApi).stream_.deviceBuffer;
    pcVar16 = pcVar13;
    if ((this->super_RtApi).stream_.doConvertBuffer[1] == false) {
      pcVar16 = (this->super_RtApi).stream_.userBuffer[1];
    }
    bVar2 = (this->super_RtApi).stream_.doConvertBuffer[0];
    inBuffer = (this->super_RtApi).stream_.userBuffer[0];
    pcVar15 = inBuffer;
    if (bVar2 != false) {
      pcVar15 = pcVar13;
    }
    if ((this->super_RtApi).stream_.state == STREAM_RUNNING) {
      if (((this->super_RtApi).stream_.mode & ~DUPLEX) == OUTPUT) {
        local_58 = pcVar16;
        if (bVar2 == false) {
          lVar11 = 600;
          lVar14 = 0x22c;
        }
        else {
          RtApi::convertBuffer
                    (&this->super_RtApi,pcVar13,inBuffer,(this->super_RtApi).stream_.convertInfo);
          lVar11 = 0x260;
          lVar14 = 0x234;
        }
        uVar3 = (this->super_RtApi).stream_.bufferSize;
        iVar9 = *(int *)((long)&(this->super_RtApi)._vptr_RtApi + lVar14);
        uVar8 = RtApi::formatBytes(&this->super_RtApi,
                                   *(RtAudioFormat *)
                                    ((long)&(this->super_RtApi)._vptr_RtApi + lVar11));
        iVar9 = pa_simple_write(*puVar4,pcVar15,uVar3 * iVar9 * uVar8,&pa_error);
        pcVar16 = local_58;
        if (iVar9 < 0) {
          poVar12 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                                    "RtApiPulse::callbackEvent: audio write error, ");
          pcVar13 = (char *)pa_strerror(pa_error);
          poVar12 = std::operator<<(poVar12,pcVar13);
          std::operator<<(poVar12,".");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,local_50);
          std::__cxx11::string::~string(local_50);
          RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
        }
      }
      if ((uint)((this->super_RtApi).stream_.mode + ~OUTPUT) < 2) {
        bVar2 = (this->super_RtApi).stream_.doConvertBuffer[1];
        uVar3 = (this->super_RtApi).stream_.bufferSize;
        uVar8 = (this->super_RtApi).stream_.nUserChannels[(ulong)bVar2 * 2 + 1];
        uVar10 = RtApi::formatBytes(&this->super_RtApi,
                                    (this->super_RtApi).stream_.deviceFormat[(ulong)bVar2 * 2 + -1])
        ;
        iVar9 = pa_simple_read(puVar4[1],pcVar16,uVar3 * uVar8 * uVar10,&pa_error);
        if (iVar9 < 0) {
          poVar12 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                                    "RtApiPulse::callbackEvent: audio read error, ");
          pcVar13 = (char *)pa_strerror(pa_error);
          poVar12 = std::operator<<(poVar12,pcVar13);
          std::operator<<(poVar12,".");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,local_50);
          std::__cxx11::string::~string(local_50);
          RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
        }
        if ((this->super_RtApi).stream_.doConvertBuffer[1] == true) {
          RtApi::convertBuffer
                    (&this->super_RtApi,(this->super_RtApi).stream_.userBuffer[1],
                     (this->super_RtApi).stream_.deviceBuffer,
                     (this->super_RtApi).stream_.convertInfo + 1);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)pSVar1);
    RtApi::tickStreamTime(&this->super_RtApi);
    if (iVar7 == 1) {
      (*(this->super_RtApi)._vptr_RtApi[7])(this);
    }
    return;
  }
  (*(this->super_RtApi)._vptr_RtApi[8])(this);
  return;
}

Assistant:

void RtApiPulse::callbackEvent( void )
{
  PulseAudioHandle *pah = static_cast<PulseAudioHandle *>( stream_.apiHandle );

  if ( stream_.state == STREAM_STOPPED ) {
    MUTEX_LOCK( &stream_.mutex );
    while ( !pah->runnable )
      pthread_cond_wait( &pah->runnable_cv, &stream_.mutex );

    if ( stream_.state != STREAM_RUNNING ) {
      MUTEX_UNLOCK( &stream_.mutex );
      return;
    }
    MUTEX_UNLOCK( &stream_.mutex );
  }

  if ( stream_.state == STREAM_CLOSED ) {
    errorText_ = "RtApiPulse::callbackEvent(): the stream is closed ... "
      "this shouldn't happen!";
    error( RTAUDIO_WARNING );
    return;
  }

  RtAudioCallback callback = (RtAudioCallback) stream_.callbackInfo.callback;
  double streamTime = getStreamTime();
  RtAudioStreamStatus status = 0;
  int doStopStream = callback( stream_.userBuffer[OUTPUT], stream_.userBuffer[INPUT],
                               stream_.bufferSize, streamTime, status,
                               stream_.callbackInfo.userData );

  if ( doStopStream == 2 ) {
    abortStream();
    return;
  }

  MUTEX_LOCK( &stream_.mutex );
  void *pulse_in = stream_.doConvertBuffer[INPUT] ? stream_.deviceBuffer : stream_.userBuffer[INPUT];
  void *pulse_out = stream_.doConvertBuffer[OUTPUT] ? stream_.deviceBuffer : stream_.userBuffer[OUTPUT];

  if ( stream_.state != STREAM_RUNNING )
    goto unlock;

  int pa_error;
  size_t bytes;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    if ( stream_.doConvertBuffer[OUTPUT] ) {
        convertBuffer( stream_.deviceBuffer,
                       stream_.userBuffer[OUTPUT],
                       stream_.convertInfo[OUTPUT] );
        bytes = stream_.nDeviceChannels[OUTPUT] * stream_.bufferSize *
                formatBytes( stream_.deviceFormat[OUTPUT] );
    } else
        bytes = stream_.nUserChannels[OUTPUT] * stream_.bufferSize *
                formatBytes( stream_.userFormat );

    if ( pa_simple_write( pah->s_play, pulse_out, bytes, &pa_error ) < 0 ) {
      errorStream_ << "RtApiPulse::callbackEvent: audio write error, " <<
        pa_strerror( pa_error ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
    }
  }

  if ( stream_.mode == INPUT || stream_.mode == DUPLEX) {
    if ( stream_.doConvertBuffer[INPUT] )
      bytes = stream_.nDeviceChannels[INPUT] * stream_.bufferSize *
        formatBytes( stream_.deviceFormat[INPUT] );
    else
      bytes = stream_.nUserChannels[INPUT] * stream_.bufferSize *
        formatBytes( stream_.userFormat );
            
    if ( pa_simple_read( pah->s_rec, pulse_in, bytes, &pa_error ) < 0 ) {
      errorStream_ << "RtApiPulse::callbackEvent: audio read error, " <<
        pa_strerror( pa_error ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
    }
    if ( stream_.doConvertBuffer[INPUT] ) {
      convertBuffer( stream_.userBuffer[INPUT],
                     stream_.deviceBuffer,
                     stream_.convertInfo[INPUT] );
    }
  }

 unlock:
  MUTEX_UNLOCK( &stream_.mutex );
  RtApi::tickStreamTime();

  if ( doStopStream == 1 )
    stopStream();
}